

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool __thiscall vkb::PhysicalDevice::is_extension_present(PhysicalDevice *this,char *ext)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  pointer __lhs;
  
  __lhs = (this->available_extensions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pbVar1 - (long)__lhs;
  for (lVar3 = lVar5 >> 7; pbVar4 = __lhs, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = std::operator==(__lhs,ext);
    if (bVar2) goto LAB_00105efb;
    bVar2 = std::operator==(__lhs + 1,ext);
    pbVar4 = __lhs + 1;
    if (bVar2) goto LAB_00105efb;
    bVar2 = std::operator==(__lhs + 2,ext);
    pbVar4 = __lhs + 2;
    if (bVar2) goto LAB_00105efb;
    bVar2 = std::operator==(__lhs + 3,ext);
    pbVar4 = __lhs + 3;
    if (bVar2) goto LAB_00105efb;
    __lhs = __lhs + 4;
    lVar5 = lVar5 + -0x80;
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pbVar4 = pbVar1;
      if ((lVar5 != 3) || (bVar2 = std::operator==(__lhs,ext), pbVar4 = __lhs, bVar2))
      goto LAB_00105efb;
      pbVar4 = __lhs + 1;
    }
    bVar2 = std::operator==(pbVar4,ext);
    if (bVar2) goto LAB_00105efb;
    __lhs = pbVar4 + 1;
  }
  bVar2 = std::operator==(__lhs,ext);
  pbVar4 = pbVar1;
  if (bVar2) {
    pbVar4 = __lhs;
  }
LAB_00105efb:
  return pbVar4 != (this->available_extensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool PhysicalDevice::is_extension_present(const char* ext) const {
    return std::find_if(std::begin(available_extensions), std::end(available_extensions), [ext](std::string const& ext_name) {
        return ext_name == ext;
    }) != std::end(available_extensions);
}